

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unigram_model.cc
# Opt level: O0

int __thiscall sentencepiece::unigram::Model::PieceToId(Model *this,string_view piece)

{
  bool bVar1;
  pointer pvVar2;
  pointer this_00;
  const_pointer key;
  size_type length;
  int local_5c;
  int local_3c;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  _Stack_38;
  int id;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  local_30;
  const_iterator it;
  Model *this_local;
  string_view piece_local;
  
  piece_local._M_len = (size_t)piece._M_str;
  this_local = (Model *)piece._M_len;
  it.
  super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
             )(_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
               )this;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
       ::find(&(this->super_ModelInterface).reserved_id_map_,(key_type *)&this_local);
  _Stack_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
       ::end(&(this->super_ModelInterface).reserved_id_map_);
  bVar1 = std::__detail::operator!=(&local_30,&stack0xffffffffffffffc8);
  if (bVar1) {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_false,_true>
                           *)&local_30);
    piece_local._M_str._4_4_ = pvVar2->second;
  }
  else {
    local_3c = 0;
    this_00 = std::
              unique_ptr<Darts::DoubleArrayImpl<void,_void,_int,_void>,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
              ::operator->(&this->trie_);
    key = std::basic_string_view<char,_std::char_traits<char>_>::data
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    length = std::basic_string_view<char,_std::char_traits<char>_>::size
                       ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    Darts::DoubleArrayImpl<void,_void,_int,_void>::exactMatchSearch<int>
              (this_00,key,&local_3c,length,0);
    if (local_3c == -1) {
      local_5c = (this->super_ModelInterface).unk_id_;
    }
    else {
      local_5c = local_3c;
    }
    piece_local._M_str._4_4_ = local_5c;
  }
  return piece_local._M_str._4_4_;
}

Assistant:

int Model::PieceToId(absl::string_view piece) const {
  auto it = reserved_id_map_.find(piece);
  if (it != reserved_id_map_.end()) {
    return it->second;
  }
  int id = 0;
  trie_->exactMatchSearch(piece.data(), id, piece.size());
  return id == -1 ? unk_id_ : id;
}